

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O3

void SRCTools::ResamplerModel::freeResamplerModel
               (FloatSampleProvider *model,FloatSampleProvider *source)

{
  FloatSampleProvider *pFVar1;
  long lVar2;
  FloatSampleProvider *currentStage;
  
  if (model != source) {
    while (lVar2 = __dynamic_cast(model,&FloatSampleProvider::typeinfo,&CascadeStage::typeinfo,0),
          lVar2 != 0) {
      pFVar1 = *(FloatSampleProvider **)(lVar2 + 0x10);
      (*model->_vptr_FloatSampleProvider[1])(model);
      if (pFVar1 == source) {
        return;
      }
      model = pFVar1;
      if (pFVar1 == (FloatSampleProvider *)0x0) {
        return;
      }
    }
  }
  return;
}

Assistant:

void ResamplerModel::freeResamplerModel(FloatSampleProvider &model, FloatSampleProvider &source) {
	FloatSampleProvider *currentStage = &model;
	while (currentStage != &source) {
		CascadeStage *cascadeStage = dynamic_cast<CascadeStage *>(currentStage);
		if (cascadeStage == NULL) return;
		FloatSampleProvider &prevStage = cascadeStage->source;
		delete currentStage;
		currentStage = &prevStage;
	}
}